

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::~IfcEdgeCurve(IfcEdgeCurve *this)

{
  ~IfcEdgeCurve((IfcEdgeCurve *)&this[-1].super_IfcEdge.field_0x50);
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}